

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O1

void __thiscall r_exec::AntiPGMController::reduce(AntiPGMController *this,View *input)

{
  list<core::P<r_exec::Overlay>_> *this_00;
  char cVar1;
  pointer pcVar2;
  int64_t iVar3;
  int iVar4;
  _Object *p_Var5;
  int64_t c;
  P<r_exec::Overlay> local_50;
  pthread_mutex_t *local_48;
  uint64_t *local_40;
  View *local_38;
  undefined4 extraout_var;
  
  local_48 = (pthread_mutex_t *)
             &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex;
  local_38 = input;
  iVar4 = pthread_mutex_lock(local_48);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  c = (this->super__PGMController).super_OController.overlays.used_cells_head;
  if (c != -1) {
    this_00 = &(this->super__PGMController).super_OController.overlays;
    local_40 = &(this->super__PGMController).super_OController.overlays.used_cell_count;
    do {
      iVar4 = (*((this_00->cells).
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[c].data.object)->_vptr__Object[4])();
      pcVar2 = (this_00->cells).
               super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((char)iVar4 == '\0') {
        p_Var5 = pcVar2[c].data.object;
        iVar4 = (*p_Var5->_vptr__Object[3])(p_Var5,local_38);
        p_Var5 = (_Object *)CONCAT44(extraout_var,iVar4);
        cVar1 = (this->super__PGMController).field_0x99;
        pcVar2 = (this->super__PGMController).super_OController.overlays.cells.
                 super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (cVar1 == '\x01') {
          p_Var5 = pcVar2[c].data.object;
          (*p_Var5->_vptr__Object[2])(p_Var5);
          *(undefined4 *)&(this->super__PGMController).super_OController.overlays.used_cells_head =
               0xffffffff;
          *(undefined4 *)
           ((long)&(this->super__PGMController).super_OController.overlays.used_cells_head + 4) =
               0xffffffff;
          *(undefined4 *)&(this->super__PGMController).super_OController.overlays.used_cells_tail =
               0xffffffff;
          *(undefined4 *)
           ((long)&(this->super__PGMController).super_OController.overlays.used_cells_tail + 4) =
               0xffffffff;
          (this->super__PGMController).super_OController.overlays.free_cells = -1;
          local_40[0] = 0;
          local_40[1] = 0;
          std::
          vector<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
          ::clear(&this_00->cells);
          LOCK();
          (p_Var5->refCount).super___atomic_base<long>._M_i =
               (p_Var5->refCount).super___atomic_base<long>._M_i + 1;
          UNLOCK();
          local_50.object = p_Var5;
          r_code::list<core::P<r_exec::Overlay>_>::push_back(this_00,&local_50);
          if (local_50.object != (_Object *)0x0) {
            LOCK();
            ((local_50.object)->refCount).super___atomic_base<long>._M_i =
                 ((local_50.object)->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if (((local_50.object)->refCount).super___atomic_base<long>._M_i < 1) {
              (*(local_50.object)->_vptr__Object[1])();
            }
          }
          (this->super__PGMController).field_0x99 = 0;
        }
        else {
          c = pcVar2[c].next;
          if (p_Var5 != (_Object *)0x0) {
            LOCK();
            (p_Var5->refCount).super___atomic_base<long>._M_i =
                 (p_Var5->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
            local_50.object = p_Var5;
            r_code::list<core::P<r_exec::Overlay>_>::push_front(this_00,&local_50);
            if (local_50.object != (_Object *)0x0) {
              LOCK();
              ((local_50.object)->refCount).super___atomic_base<long>._M_i =
                   ((local_50.object)->refCount).super___atomic_base<long>._M_i + -1;
              UNLOCK();
              if (((local_50.object)->refCount).super___atomic_base<long>._M_i < 1) {
                (*(local_50.object)->_vptr__Object[1])();
              }
            }
          }
        }
        if (cVar1 != '\0') break;
      }
      else {
        iVar3 = pcVar2[c].next;
        r_code::list<core::P<r_exec::Overlay>_>::__erase(this_00,c);
        c = iVar3;
      }
    } while (c != -1);
  }
  pthread_mutex_unlock(local_48);
  return;
}

Assistant:

void AntiPGMController::reduce(r_exec::View *input)
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);
    r_code::list<P<Overlay> >::const_iterator o;

    for (o = overlays.begin(); o != overlays.end();) {
        if ((*o)->is_invalidated()) {
            o = overlays.erase(o);
        } else {
            Overlay *offspring = (*o)->reduce_view(input);

            if (successful_match) { // the controller has been restarted: reset the overlay and kill all others
                Overlay *overlay = *o;
                overlay->reset();
                overlays.clear();
                overlays.push_back(overlay);
                successful_match = false;
                break;
            }

            ++o;

            if (offspring) {
                overlays.push_front(offspring);
            }
        }
    }
}